

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatedamagebin.cpp
# Opt level: O3

void __thiscall ValidateDamageBin::CheckFirstBin(ValidateDamageBin *this,bool convertToBin)

{
  int *piVar1;
  float fVar2;
  size_t sVar3;
  
  fVar2 = (this->dbd_).bin_from;
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    CheckFirstBin(this);
  }
  if ((this->dbd_).bin_index != 1) {
    CheckFirstBin(this);
  }
  CheckInterpolationDamageValuesWithinRange(this);
  piVar1 = &(this->super_Validate).lineno_;
  *piVar1 = *piVar1 + 1;
  this->prevBinIndex_ = (this->dbd_).bin_index;
  sVar3 = strlen((char *)this);
  memcpy(this->prevLine_,this,sVar3 + 1);
  sVar3 = strlen((char *)this);
  this->prevLine_[sVar3 - 1] = '\0';
  if (convertToBin) {
    fwrite(&this->dbd_,0x14,1,_stdout);
    return;
  }
  return;
}

Assistant:

void ValidateDamageBin::CheckFirstBin(const bool convertToBin) {
/* First bin should have a bin index of 1. Additionally, in most cases the
 * lower limit for the first bin should be 0. */

  if (dbd_.bin_from != 0.0) {

    fprintf(stderr, "WARNING: Lower limit for first bin is not 0."
                    " Are you sure this is what you want?:\n%s\n",
                    line_);
    warnings_ = true;

  }

  if (dbd_.bin_index != 1) {

    fprintf(stderr, "ERROR: First bin index must be 1:\n%s\n", line_);
    PrintErrorMessage();

  }

  CheckInterpolationDamageValuesWithinRange();
  StoreLine();
  if (convertToBin) ConvertToBin();

}